

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:492:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:492:17)>
             *this)

{
  int (*paiVar1) [2];
  int osErrorNumber;
  ssize_t sVar2;
  Fault local_20;
  
  anon_unknown_0::delay();
  paiVar1 = (this->f).pipefds;
  do {
    sVar2 = ::write((*paiVar1)[1],"foo",3);
    if (-1 < sVar2) {
      return;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,0x1ee,osErrorNumber,"write(pipefds[1], \"foo\", 3)","");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }